

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Client::process_request
          (Client *this,Stream *strm,Request *req,Response *res,bool last_connection,
          bool *connection_close)

{
  bool bVar1;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  int dummy_status;
  function<bool_(const_char_*,_unsigned_long)> local_70;
  function<bool_(unsigned_long,_unsigned_long)> local_50;
  
  bVar1 = write_request(this,strm,req,last_connection);
  if (!bVar1) {
    return false;
  }
  bVar1 = read_response_line(this,strm,res);
  if (!bVar1) {
    return false;
  }
  bVar1 = detail::read_headers(strm,&res->headers);
  if (!bVar1) {
    return false;
  }
  Response::get_header_value_abi_cxx11_((string *)&local_98,res,"Connection",0);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_98,"close");
  if (bVar1) {
    std::__cxx11::string::~string((string *)local_98._M_pod_data);
  }
  else {
    bVar1 = std::operator==(&res->version,"HTTP/1.0");
    std::__cxx11::string::~string((string *)local_98._M_pod_data);
    if (!bVar1) goto LAB_001812e8;
  }
  *connection_close = true;
LAB_001812e8:
  if (((req->response_handler).super__Function_base._M_manager != (_Manager_type)0x0) &&
     (bVar1 = std::function<bool_(const_httplib::Response_&)>::operator()
                        (&req->response_handler,res), !bVar1)) {
    return false;
  }
  bVar1 = std::operator!=(&req->method,"HEAD");
  if ((bVar1) && (bVar1 = std::operator!=(&req->method,"CONNECT"), bVar1)) {
    local_98._8_8_ = 0;
    local_80 = std::
               _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/httplib/httplib.h:3827:27)>
               ::_M_invoke;
    local_88 = std::
               _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/httplib/httplib.h:3827:27)>
               ::_M_manager;
    local_98._M_unused._M_object = res;
    if ((req->content_receiver).super__Function_base._M_manager != (_Manager_type)0x0) {
      _dummy_status = req;
      std::function<bool(char_const*,unsigned_long)>::operator=
                ((function<bool(char_const*,unsigned_long)> *)local_98._M_pod_data,
                 (anon_class_8_1_ba1d73fe *)&dummy_status);
    }
    std::function<bool_(unsigned_long,_unsigned_long)>::function(&local_50,&req->progress);
    std::function<bool_(const_char_*,_unsigned_long)>::function
              (&local_70,(function<bool_(const_char_*,_unsigned_long)> *)&local_98);
    bVar1 = detail::read_content<httplib::Response>
                      (strm,res,0xffffffffffffffff,&dummy_status,&local_50,&local_70);
    std::_Function_base::~_Function_base(&local_70.super__Function_base);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    std::_Function_base::~_Function_base((_Function_base *)&local_98);
    if (!bVar1) {
      return false;
    }
  }
  if ((this->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::operator()
              (&this->logger_,req,res);
    return true;
  }
  return true;
}

Assistant:

inline bool Client::process_request(Stream &strm, const Request &req,
                                    Response &res, bool last_connection,
                                    bool &connection_close) {
  // Send request
  if (!write_request(strm, req, last_connection)) { return false; }

  // Receive response and headers
  if (!read_response_line(strm, res) ||
      !detail::read_headers(strm, res.headers)) {
    return false;
  }

  if (res.get_header_value("Connection") == "close" ||
      res.version == "HTTP/1.0") {
    connection_close = true;
  }

  if (req.response_handler) {
    if (!req.response_handler(res)) { return false; }
  }

  // Body
  if (req.method != "HEAD" && req.method != "CONNECT") {
    ContentReceiver out = [&](const char *buf, size_t n) {
      if (res.body.size() + n > res.body.max_size()) { return false; }
      res.body.append(buf, n);
      return true;
    };

    if (req.content_receiver) {
      out = [&](const char *buf, size_t n) {
        return req.content_receiver(buf, n);
      };
    }

    int dummy_status;
    if (!detail::read_content(strm, res, std::numeric_limits<size_t>::max(),
                              dummy_status, req.progress, out)) {
      return false;
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return true;
}